

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleGenerateCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  bool bVar2;
  pointer pbVar3;
  string output;
  string condition;
  string input;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3) < 0x81) {
    std::__cxx11::string::string
              ((string *)&local_58,"Incorrect arguments to GENERATE subcommand.",
               (allocator *)&local_78);
    cmCommand::SetError(&this->super_cmCommand,&local_58);
LAB_00364b78:
    std::__cxx11::string::~string((string *)&local_58);
    return false;
  }
  bVar1 = std::operator!=(pbVar3 + 1,"OUTPUT");
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&local_58,"Incorrect arguments to GENERATE subcommand.",
               (allocator *)&local_78);
    cmCommand::SetError(&this->super_cmCommand,&local_58);
    goto LAB_00364b78;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3) < 0xa1) {
LAB_00364c27:
    std::__cxx11::string::string((string *)&local_78,(string *)(pbVar3 + 2));
    bVar1 = std::operator!=((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 3,"INPUT");
    if ((bVar1) &&
       (bVar2 = std::operator!=((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 3,"CONTENT"), bVar2)) {
      std::__cxx11::string::string
                ((string *)&local_38,"Incorrect arguments to GENERATE subcommand.",&local_79);
      cmCommand::SetError(&this->super_cmCommand,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      bVar1 = false;
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_38,
                 (string *)
                 ((args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + 4));
      AddEvaluationFile(this,&local_38,&local_78,&local_58,bVar1);
      std::__cxx11::string::~string((string *)&local_38);
      bVar1 = true;
    }
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    bVar1 = std::operator!=(pbVar3 + 5,"CONDITION");
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_78,"Incorrect arguments to GENERATE subcommand.",
                 (allocator *)&local_38);
      cmCommand::SetError(&this->super_cmCommand,&local_78);
    }
    else if ((long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start == 0xe0) {
      std::__cxx11::string::_M_assign((string *)&local_58);
      if (local_58._M_string_length != 0) {
        pbVar3 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        goto LAB_00364c27;
      }
      std::__cxx11::string::string
                ((string *)&local_78,
                 "CONDITION of sub-command GENERATE must not be empty if specified.",
                 (allocator *)&local_38);
      cmCommand::SetError(&this->super_cmCommand,&local_78);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_78,"Incorrect arguments to GENERATE subcommand.",
                 (allocator *)&local_38);
      cmCommand::SetError(&this->super_cmCommand,&local_78);
    }
    std::__cxx11::string::~string((string *)&local_78);
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_58);
  return bVar1;
}

Assistant:

bool cmFileCommand::HandleGenerateCommand(std::vector<std::string> const& args)
{
  if (args.size() < 5) {
    this->SetError("Incorrect arguments to GENERATE subcommand.");
    return false;
  }
  if (args[1] != "OUTPUT") {
    this->SetError("Incorrect arguments to GENERATE subcommand.");
    return false;
  }
  std::string condition;
  if (args.size() > 5) {
    if (args[5] != "CONDITION") {
      this->SetError("Incorrect arguments to GENERATE subcommand.");
      return false;
    }
    if (args.size() != 7) {
      this->SetError("Incorrect arguments to GENERATE subcommand.");
      return false;
    }
    condition = args[6];
    if (condition.empty()) {
      this->SetError("CONDITION of sub-command GENERATE must not be empty if "
                     "specified.");
      return false;
    }
  }
  std::string output = args[2];
  const bool inputIsContent = args[3] != "INPUT";
  if (inputIsContent && args[3] != "CONTENT") {
    this->SetError("Incorrect arguments to GENERATE subcommand.");
    return false;
  }
  std::string input = args[4];

  this->AddEvaluationFile(input, output, condition, inputIsContent);
  return true;
}